

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O3

PCMI VIRTUALFindRegionInformation(UINT_PTR address)

{
  _CMI *p_Var1;
  PCMI p_Var2;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  p_Var1 = pVirtualMemory;
  if (pVirtualMemoryLastFound == (PCMI)0x0) goto LAB_001d2749;
  if (address < pVirtualMemoryLastFound->startBoundary) goto LAB_001d2749;
  p_Var1 = pVirtualMemoryLastFound;
  p_Var2 = pVirtualMemoryLastFound;
  if (pVirtualMemoryLastFound->startBoundary != address) {
    do {
      if (address < p_Var1->startBoundary) break;
      if (address < p_Var1->startBoundary + p_Var1->memSize) {
        pVirtualMemoryLastFound = p_Var1;
        return p_Var1;
      }
      p_Var1 = p_Var1->pNext;
LAB_001d2749:
    } while (p_Var1 != (PCMI)0x0);
    p_Var2 = (PCMI)0x0;
  }
  return p_Var2;
}

Assistant:

static PCMI VIRTUALFindRegionInformation( IN UINT_PTR address )
{
    PCMI pEntry = NULL;

    TRACE( "VIRTUALFindRegionInformation( %#x )\n", address );

    pEntry = pVirtualMemory;

    if (pVirtualMemoryLastFound && pVirtualMemoryLastFound->startBoundary <= address)
    {
        pEntry = pVirtualMemoryLastFound;
        if (pEntry->startBoundary == address)
        {
            return pEntry;
        }
    }
    else
    {
        pEntry = pVirtualMemory;
    }

    while( pEntry )
    {
        if ( pEntry->startBoundary > address )
        {
            /* Gone past the possible location in the list. */
            pEntry = NULL;
            break;
        }
        if ( pEntry->startBoundary + pEntry->memSize > address )
        {
            break;
        }

        pEntry = pEntry->pNext;
    }

    if (pEntry) pVirtualMemoryLastFound = pEntry;
    return pEntry;
}